

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings.h
# Opt level: O0

void __thiscall
PartiallyDownloadedBlock::PartiallyDownloadedBlock
          (PartiallyDownloadedBlock *this,CTxMemPool *poolIn)

{
  long lVar1;
  _Manager_type in_RSI;
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
  *in_RDI;
  long in_FS_OFFSET;
  CBlockHeader *in_stack_ffffffffffffffb8;
  nullptr_t in_stack_ffffffffffffffc0;
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
  *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_ffffffffffffffb8);
  in_RDI->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&in_RDI[1].super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&in_RDI[1].super__Function_base._M_functor + 8) = 0;
  in_RDI[1].super__Function_base._M_manager = in_RSI;
  CBlockHeader::CBlockHeader(in_stack_ffffffffffffffb8);
  std::
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>::
  function(this_00,in_stack_ffffffffffffffc0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit PartiallyDownloadedBlock(CTxMemPool* poolIn) : pool(poolIn) {}